

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testRgbaThreading.cpp
# Opt level: O3

void testRgbaThreading(string *tempDir)

{
  pointer pcVar1;
  double dVar2;
  bool bVar3;
  char cVar4;
  ushort uVar5;
  uint uVar6;
  void *pvVar7;
  ulong uVar8;
  long *plVar9;
  uint uVar10;
  bool bVar11;
  LineOrder in_R9D;
  int x;
  int iVar12;
  long lVar13;
  Array2D<Imf_3_2::Rgba> *p1_00;
  int y;
  RgbaChannels channels;
  long lVar14;
  float fVar15;
  float fVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  Array2D<Imf_3_2::Rgba> p1;
  long local_78 [2];
  double local_68;
  undefined8 local_60;
  undefined8 local_58;
  void *local_50;
  double local_48;
  double local_40;
  double local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing setGlobalThreadCount()",0x1e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  cVar4 = IlmThread_3_2::supportsThreads();
  if (cVar4 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   Threading not supported!",0x1b);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    plVar9 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
    std::ostream::put((char)plVar9);
    std::ostream::flush();
  }
  else {
    uVar5 = 0;
    iVar12 = 0;
    do {
      fVar15 = (float)Imath_3_2::Rand32::nextf();
      Imf_3_2::setGlobalThreadCount((int)(fVar15 * 32.0 + 0.5));
      if ((ushort)((uVar5 / 2000) * -2000) == (short)iVar12) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,".",1);
        std::ostream::flush();
      }
      iVar12 = iVar12 + -1;
      uVar5 = uVar5 + 1;
    } while (iVar12 != -10000);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nok\n",4);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Testing multi-threaded writing of scanlines\nin random-sized blocks",0x42);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    local_60 = 0x77;
    local_58 = 0xed;
    pvVar7 = operator_new__(0x37158);
    lVar14 = 0;
    local_50 = pvVar7;
    do {
      local_38 = (double)(int)lVar14;
      local_40 = local_38 * 0.1;
      local_48 = local_38 * 0.2;
      local_38 = local_38 * 0.3;
      lVar13 = 0;
      do {
        local_68 = (double)(int)lVar13;
        dVar2 = sin(local_68 * 0.1 + local_40);
        fVar16 = (float)(dVar2 * 0.5 + 0.5);
        fVar15 = ABS(fVar16);
        uVar5 = (ushort)((uint)fVar16 >> 0x10) & 0x8000;
        if ((uint)fVar15 < 0x38800000) {
          if ((0x33000000 < (uint)fVar15) &&
             (uVar6 = (uint)fVar15 & 0x7fffff | 0x800000, cVar4 = (char)((uint)fVar15 >> 0x17),
             uVar5 = uVar5 | (ushort)(uVar6 >> (0x7eU - cVar4 & 0x1f)),
             0x80000000 < uVar6 << (cVar4 + 0xa2U & 0x1f))) {
            uVar5 = uVar5 + 1;
          }
        }
        else if ((uint)fVar15 < 0x7f800000) {
          if ((uint)fVar15 < 0x477ff000) {
            uVar5 = (ushort)((int)fVar15 + 0x8000fff + (uint)(((uint)fVar15 >> 0xd & 1) != 0) >> 0xd
                            ) | uVar5;
          }
          else {
            uVar5 = uVar5 | 0x7c00;
          }
        }
        else {
          uVar5 = uVar5 | 0x7c00;
          if (fVar15 != INFINITY) {
            uVar6 = (uint)fVar15 >> 0xd & 0x3ff;
            uVar5 = uVar5 | (ushort)uVar6 | (ushort)(uVar6 == 0);
          }
        }
        *(ushort *)((long)pvVar7 + lVar13 * 8) = uVar5;
        dVar2 = sin(local_68 * 0.1 + local_48);
        fVar16 = (float)(dVar2 * 0.5 + 0.5);
        fVar15 = ABS(fVar16);
        uVar5 = (ushort)((uint)fVar16 >> 0x10) & 0x8000;
        if ((uint)fVar15 < 0x38800000) {
          if ((0x33000000 < (uint)fVar15) &&
             (uVar6 = (uint)fVar15 & 0x7fffff | 0x800000, cVar4 = (char)((uint)fVar15 >> 0x17),
             uVar5 = uVar5 | (ushort)(uVar6 >> (0x7eU - cVar4 & 0x1f)),
             0x80000000 < uVar6 << (cVar4 + 0xa2U & 0x1f))) {
            uVar5 = uVar5 + 1;
          }
        }
        else if ((uint)fVar15 < 0x7f800000) {
          if ((uint)fVar15 < 0x477ff000) {
            uVar5 = (ushort)((int)fVar15 + 0x8000fff + (uint)(((uint)fVar15 >> 0xd & 1) != 0) >> 0xd
                            ) | uVar5;
          }
          else {
            uVar5 = uVar5 | 0x7c00;
          }
        }
        else {
          uVar5 = uVar5 | 0x7c00;
          if (fVar15 != INFINITY) {
            uVar6 = (uint)fVar15 >> 0xd & 0x3ff;
            uVar5 = uVar5 | (ushort)uVar6 | (ushort)(uVar6 == 0);
          }
        }
        *(ushort *)((long)pvVar7 + lVar13 * 8 + 2) = uVar5;
        dVar2 = sin(local_68 * 0.1 + local_38);
        fVar16 = (float)(dVar2 * 0.5 + 0.5);
        fVar15 = ABS(fVar16);
        uVar6 = (uint)fVar16 >> 0x10 & 0x8000;
        if ((uint)fVar15 < 0x38800000) {
          if ((0x33000000 < (uint)fVar15) &&
             (uVar10 = (uint)fVar15 & 0x7fffff | 0x800000, cVar4 = (char)((uint)fVar15 >> 0x17),
             uVar6 = uVar6 | uVar10 >> (0x7eU - cVar4 & 0x1f),
             0x80000000 < uVar10 << (cVar4 + 0xa2U & 0x1f))) {
            uVar6 = uVar6 + 1;
          }
        }
        else if ((uint)fVar15 < 0x7f800000) {
          if ((uint)fVar15 < 0x477ff000) {
            uVar6 = (int)fVar15 + 0x8000fff + (uint)(((uint)fVar15 >> 0xd & 1) != 0) >> 0xd | uVar6;
          }
          else {
            uVar6 = uVar6 | 0x7c00;
          }
        }
        else {
          uVar6 = uVar6 | 0x7c00;
          if (fVar15 != INFINITY) {
            uVar10 = (uint)fVar15 >> 0xd & 0x3ff;
            uVar6 = uVar6 | uVar10 | (uint)(uVar10 == 0);
          }
        }
        *(short *)((long)pvVar7 + lVar13 * 8 + 4) = (short)uVar6;
        fVar16 = (*(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)((long)pvVar7 + lVar13 * 8) * 4) +
                  *(float *)(_imath_half_to_float_table + (ulong)(uVar6 & 0xffff) * 4) +
                 *(float *)(_imath_half_to_float_table +
                           (ulong)*(ushort *)((long)pvVar7 + lVar13 * 8 + 2) * 4)) / 3.0;
        fVar15 = ABS(fVar16);
        uVar5 = (ushort)((uint)fVar16 >> 0x10) & 0x8000;
        if ((uint)fVar15 < 0x38800000) {
          if ((0x33000000 < (uint)fVar15) &&
             (uVar6 = (uint)fVar15 & 0x7fffff | 0x800000, cVar4 = (char)((uint)fVar15 >> 0x17),
             uVar5 = uVar5 | (ushort)(uVar6 >> (0x7eU - cVar4 & 0x1f)),
             0x80000000 < uVar6 << (cVar4 + 0xa2U & 0x1f))) {
            uVar5 = uVar5 + 1;
          }
        }
        else if ((uint)fVar15 < 0x7f800000) {
          if ((uint)fVar15 < 0x477ff000) {
            uVar5 = (ushort)((int)fVar15 + 0x8000fff + (uint)(((uint)fVar15 >> 0xd & 1) != 0) >> 0xd
                            ) | uVar5;
          }
          else {
            uVar5 = uVar5 | 0x7c00;
          }
        }
        else {
          uVar5 = uVar5 | 0x7c00;
          if (fVar15 != INFINITY) {
            uVar6 = (uint)fVar15 >> 0xd & 0x3ff;
            uVar5 = uVar5 | (ushort)uVar6 | (ushort)(uVar6 == 0);
          }
        }
        *(ushort *)((long)pvVar7 + lVar13 * 8 + 6) = uVar5;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0xed);
      lVar14 = lVar14 + 1;
      pvVar7 = (void *)((long)pvVar7 + 0x768);
    } while (lVar14 != 0x77);
    uVar8 = 0;
    do {
      local_68 = (double)uVar8;
      Imf_3_2::setGlobalThreadCount((int)uVar8 * 3 & 7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"number of threads: ",0x13);
      iVar12 = Imf_3_2::globalThreadCount();
      plVar9 = (long *)std::ostream::operator<<(&std::cout,iVar12);
      std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
      std::ostream::put((char)plVar9);
      std::ostream::flush();
      channels = 0;
      do {
        p1_00 = (Array2D<Imf_3_2::Rgba> *)0x0;
        bVar3 = true;
        do {
          bVar11 = bVar3;
          pcVar1 = (tempDir->_M_dataplus)._M_p;
          plVar9 = local_78;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&stack0xffffffffffffff78,pcVar1,pcVar1 + tempDir->_M_string_length);
          std::__cxx11::string::append(&stack0xffffffffffffff78);
          anon_unknown.dwarf_2c5292::writeReadRGBA
                    ((char *)plVar9,(int)&local_60,0xf,p1_00,channels,in_R9D,(Compression)plVar9);
          if (plVar9 != local_78) {
            operator_delete(plVar9,local_78[0] + 1);
          }
          pcVar1 = (tempDir->_M_dataplus)._M_p;
          plVar9 = local_78;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&stack0xffffffffffffff78,pcVar1,pcVar1 + tempDir->_M_string_length);
          std::__cxx11::string::append(&stack0xffffffffffffff78);
          anon_unknown.dwarf_2c5292::writeReadRGBA
                    ((char *)plVar9,(int)&local_60,7,p1_00,channels,in_R9D,(Compression)plVar9);
          if (plVar9 != local_78) {
            operator_delete(plVar9,local_78[0] + 1);
          }
          pcVar1 = (tempDir->_M_dataplus)._M_p;
          plVar9 = local_78;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&stack0xffffffffffffff78,pcVar1,pcVar1 + tempDir->_M_string_length);
          std::__cxx11::string::append(&stack0xffffffffffffff78);
          anon_unknown.dwarf_2c5292::writeReadRGBA
                    ((char *)plVar9,(int)&local_60,8,p1_00,channels,in_R9D,(Compression)plVar9);
          if (plVar9 != local_78) {
            operator_delete(plVar9,local_78[0] + 1);
          }
          pcVar1 = (tempDir->_M_dataplus)._M_p;
          plVar9 = local_78;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&stack0xffffffffffffff78,pcVar1,pcVar1 + tempDir->_M_string_length);
          std::__cxx11::string::append(&stack0xffffffffffffff78);
          anon_unknown.dwarf_2c5292::writeReadRGBA
                    ((char *)plVar9,(int)&local_60,5,p1_00,channels,in_R9D,(Compression)plVar9);
          if (plVar9 != local_78) {
            operator_delete(plVar9,local_78[0] + 1);
          }
          p1_00 = (Array2D<Imf_3_2::Rgba> *)0x1;
          bVar3 = false;
        } while (bVar11);
        channels = channels + WRITE_R;
      } while (channels != (WRITE_A|WRITE_G));
      uVar6 = SUB84(local_68,0) + 1;
      uVar8 = (ulong)uVar6;
    } while (uVar6 != 9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok\n",3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    if (local_50 != (void *)0x0) {
      operator_delete__(local_50);
    }
  }
  return;
}

Assistant:

void
testRgbaThreading (const std::string& tempDir)
{
    try
    {
        cout << "Testing setGlobalThreadCount()" << endl;

        if (!ILMTHREAD_NAMESPACE::supportsThreads ())
        {
            cout << "   Threading not supported!" << endl << endl;
            return;
        }

        for (int i = 0; i < 10000; i++)
        {
            int numThreads = int (rand1.nextf () * 32 + 0.5f);
            setGlobalThreadCount (numThreads);

            if (i % 2000 == 0) cout << "." << flush;
        }

        cout << "\nok\n" << endl;

        cout << "Testing multi-threaded writing of scanlines\n"
                "in random-sized blocks"
             << endl;

        const int W = 237;
        const int H = 119;

        Array2D<Rgba> p1 (H, W);
        fillPixels (p1, W, H);

        for (int n = 0; n <= 8; n++)
        {
            int numThreads = (n * 3) % 8;

            setGlobalThreadCount (numThreads);
            cout << "number of threads: " << globalThreadCount () << endl;

            for (int comp = 0; comp < NUM_COMPRESSION_METHODS; ++comp)
            {
                for (int lorder = 0; lorder < RANDOM_Y; ++lorder)
                {
                    writeReadRGBA (
                        (tempDir + "imf_test_rgba.exr").c_str (),
                        W,
                        H,
                        p1,
                        WRITE_RGBA,
                        LineOrder (lorder),
                        Compression (comp));

                    writeReadRGBA (
                        (tempDir + "imf_test_rgba.exr").c_str (),
                        W,
                        H,
                        p1,
                        WRITE_RGB,
                        LineOrder (lorder),
                        Compression (comp));

                    writeReadRGBA (
                        (tempDir + "imf_test_rgba.exr").c_str (),
                        W,
                        H,
                        p1,
                        WRITE_A,
                        LineOrder (lorder),
                        Compression (comp));

                    writeReadRGBA (
                        (tempDir + "imf_test_rgba.exr").c_str (),
                        W,
                        H,
                        p1,
                        RgbaChannels (WRITE_R | WRITE_B),
                        LineOrder (lorder),
                        Compression (comp));
                }
            }
        }

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}